

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O1

void __thiscall
Centaurus::DryParserEM64T<wchar_t>::DryParserEM64T
          (DryParserEM64T<wchar_t> *this,Grammar<wchar_t> *grammar,Logger *logger)

{
  CodeHolder *this_00;
  Operand_ *o0;
  mapped_type *pmVar1;
  socklen_t __len;
  CompositeATN<wchar_t> *o1;
  sockaddr *__addr;
  _Hash_node_base *p_Var2;
  __node_base *p_Var3;
  Label rejectlabel;
  unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
  machine_map;
  CompositeATN<wchar_t> catn;
  X86Assembler as;
  MyConstPool pool;
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [64];
  undefined1 local_260 [72];
  undefined1 local_218 [24];
  Assembler local_200;
  undefined1 local_148 [12];
  undefined4 local_13c;
  ConstPool local_120;
  undefined1 local_40 [16];
  
  (this->super_IParser)._vptr_IParser = (_func_int **)&PTR__DryParserEM64T_001bf6e0;
  asmjit::JitRuntime::JitRuntime(&this->m_runtime);
  this_00 = &this->m_code;
  asmjit::CodeHolder::CodeHolder(this_00);
  asmjit::CodeHolder::init
            (this_00,(EVP_PKEY_CTX *)&(this->m_runtime).super_HostRuntime.super_Runtime._codeInfo);
  if (logger != (Logger *)0x0) {
    asmjit::CodeHolder::setLogger(this_00,logger);
  }
  asmjit::X86Assembler::X86Assembler((X86Assembler *)&local_200,this_00);
  local_2a0._8_8_ = local_2a0 + 0x38;
  local_2a0._16_8_ = (CodeEmitter *)0x1;
  local_2a0._24_8_ = (_Hash_node_base *)0x0;
  local_2a0._32_8_ = 0;
  local_2a0._40_4_ = 1.0;
  local_2a0._48_4_ = 0;
  local_2a0._52_4_ = 0;
  local_2a0._56_8_ = (__node_base_ptr)0x0;
  emit_parser_prolog((X86Assembler *)&local_200);
  local_148._0_8_ = &DAT_00000032;
  o1 = (CompositeATN<wchar_t> *)local_148;
  local_13c = 4;
  local_148._8_4_ = 0x20;
  asmjit::CodeEmitter::emit
            (&local_200.super_CodeEmitter,0x189,(Operand_ *)(asmjit::x86OpData + 0x4e0),
             (Operand_ *)o1);
  MyConstPool::MyConstPool((MyConstPool *)local_148,(X86Assembler *)&local_200);
  local_218._0_8_ = 0x110000149;
  local_218._8_8_ = 0;
  MyConstPool::load_charclass_filter<wchar_t>
            ((MyConstPool *)local_148,(X86Xmm *)local_218,(CharClass<wchar_t> *)m_skipfilter);
  asmjit::Assembler::newLabel((Assembler *)local_2b0);
  p_Var2 = (grammar->m_networks)._M_h._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    do {
      asmjit::Assembler::newLabel((Assembler *)local_260);
      std::
      _Hashtable<Centaurus::Identifier,std::pair<Centaurus::Identifier_const,asmjit::Label>,std::allocator<std::pair<Centaurus::Identifier_const,asmjit::Label>>,std::__detail::_Select1st,std::equal_to<Centaurus::Identifier>,std::hash<Centaurus::Identifier>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<Centaurus::Identifier_const&,asmjit::Label>
                ((_Hashtable<Centaurus::Identifier,std::pair<Centaurus::Identifier_const,asmjit::Label>,std::allocator<std::pair<Centaurus::Identifier_const,asmjit::Label>>,std::__detail::_Select1st,std::equal_to<Centaurus::Identifier>,std::hash<Centaurus::Identifier>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)local_2a0,p_Var2 + 1,(Assembler *)local_260);
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  o0 = (Operand_ *)
       std::__detail::
       _Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
       ::operator[]((_Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)local_2a0,&grammar->m_root_id);
  asmjit::CodeEmitter::emit(&local_200.super_CodeEmitter,0x3b,o0);
  emit_parser_epilog((X86Assembler *)&local_200,(Label *)local_2b0);
  CompositeATN<wchar_t>::CompositeATN((CompositeATN<wchar_t> *)local_260,grammar);
  p_Var3 = &(grammar->m_networks)._M_h._M_before_begin;
  while( true ) {
    __len = (socklen_t)o1;
    p_Var3 = p_Var3->_M_nxt;
    if (p_Var3 == (__node_base *)0x0) break;
    pmVar1 = std::__detail::
             _Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)local_2a0,(key_type *)(p_Var3 + 1));
    asmjit::Assembler::bind(&local_200,(int)pmVar1,__addr,__len);
    o1 = (CompositeATN<wchar_t> *)local_260;
    emit_machine((X86Assembler *)&local_200,(ATNMachine<wchar_t> *)(p_Var3 + 6),
                 (unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
                  *)local_2a0,(CompositeATN<wchar_t> *)local_260,(key_type *)(p_Var3 + 1),
                 (Label *)local_2b0,(MyConstPool *)local_148);
  }
  (*(((Assembler *)local_148._0_8_)->super_CodeEmitter)._vptr_CodeEmitter[0xd])
            (local_148._0_8_,local_40,&local_120);
  asmjit::CodeEmitter::finalize(&local_200.super_CodeEmitter);
  local_260._0_8_ = &PTR__CompositeATN_001c0488;
  std::
  _Hashtable<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<wchar_t>_>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<wchar_t>_>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<wchar_t>_>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<wchar_t>_>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_260 + 8));
  asmjit::ConstPool::~ConstPool(&local_120);
  asmjit::Zone::~Zone((Zone *)(local_148 + 8));
  std::
  _Hashtable<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_2a0);
  asmjit::X86Assembler::~X86Assembler((X86Assembler *)&local_200);
  return;
}

Assistant:

DryParserEM64T<TCHAR>::DryParserEM64T(const Grammar<TCHAR>& grammar, asmjit::Logger *logger)
{
    m_code.init(m_runtime.getCodeInfo());
    if (logger != NULL)
        m_code.setLogger(logger);

    asmjit::X86Assembler as(&m_code);

    std::unordered_map<Identifier, asmjit::Label> machine_map;

    emit_parser_prolog(as);

    as.mov(INPUT_REG, asmjit::X86Mem(asmjit::x86::rsp, ARG1_STACK_OFFSET));

    MyConstPool pool(as);

    pool.load_charclass_filter(PATTERN_REG, m_skipfilter);

    asmjit::Label rejectlabel = as.newLabel();

    {
        for (const auto& p : grammar.get_machines())
        {
            machine_map.emplace(p.first, as.newLabel());
        }

        as.call(machine_map[grammar.get_root_id()]);
    }

    emit_parser_epilog(as, rejectlabel);

    CompositeATN<TCHAR> catn(grammar);

    for (const auto& p : grammar.get_machines())
    {
        as.bind(machine_map[p.first]);

        emit_machine(as, p.second, machine_map, catn, p.first, rejectlabel, pool);
    }

    pool.embed();

    as.finalize();
}